

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createTriOp(Builder *this,Op opCode,Id typeId,Id op1,Id op2,Id op3)

{
  value_type vVar1;
  Id resultId;
  reference pvVar2;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  Instruction *local_70;
  Instruction *op;
  allocator<unsigned_int> local_49;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  Id op3_local;
  Id op2_local;
  Id op1_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = op3;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    resultId = getUniqueId(this);
    spv::Instruction::Instruction(this_00,resultId,typeId,opCode);
    local_70 = this_00;
    spv::Instruction::reserveOperands(this_00,3);
    spv::Instruction::addIdOperand(local_70,op1);
    spv::Instruction::addIdOperand(local_70,op2);
    spv::Instruction::addIdOperand
              (local_70,operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_78,
               local_70);
    addInstruction(this,&local_78);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_78);
    this_local._4_4_ = spv::Instruction::getResultId(local_70);
  }
  else {
    std::allocator<unsigned_int>::allocator(&local_49);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,3,&local_49);
    std::allocator<unsigned_int>::~allocator(&local_49);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
    *pvVar2 = op1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,1);
    vVar1 = operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    *pvVar2 = op2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,2);
    *pvVar2 = vVar1;
    memset(&op,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,opCode,typeId,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&op);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createTriOp(Op opCode, Id typeId, Id op1, Id op2, Id op3)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        std::vector<Id> operands(3);
        operands[0] = op1;
        operands[1] = op2;
        operands[2] = op3;
        return createSpecConstantOp(
            opCode, typeId, operands, std::vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->reserveOperands(3);
    op->addIdOperand(op1);
    op->addIdOperand(op2);
    op->addIdOperand(op3);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}